

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_error.cpp
# Opt level: O0

char * ON_ErrorEvent::TypeToString(Type event_type)

{
  char *local_18;
  char *s;
  Type event_type_local;
  
  switch(event_type) {
  case Unset:
    local_18 = "Unset";
    break;
  case Warning:
    local_18 = "Warning";
    break;
  case Error:
    local_18 = "Error";
    break;
  case Assert:
    local_18 = "Assert";
    break;
  case Custom:
    local_18 = "Custom";
    break;
  case SubDError:
    local_18 = "SubDError";
    break;
  default:
    local_18 = "Invalid";
    break;
  case NotValid:
    local_18 = "NotValid";
  }
  return local_18;
}

Assistant:

const char* ON_ErrorEvent::TypeToString(
  ON_ErrorEvent::Type event_type
)
{
  const char* s;
  switch (event_type)
  {
  case ON_ErrorEvent::Type::Unset:
    s = "Unset";
    break;
  case ON_ErrorEvent::Type::Warning:
    s = "Warning";
    break;
  case ON_ErrorEvent::Type::Error:
    s = "Error";
    break;
  case ON_ErrorEvent::Type::Assert:
    s = "Assert";
    break;
  case ON_ErrorEvent::Type::Custom:
    s = "Custom";
    break;
  case ON_ErrorEvent::Type::SubDError:
    s = "SubDError";
    break;
  case ON_ErrorEvent::Type::NotValid:
    s = "NotValid";
    break;
  default:
    s = "Invalid";
    break;
  }

  return s;
}